

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# within.hpp
# Opt level: O0

type_conflict
perior::within<perior::point<double,2ul>,perior::cubic_periodic_boundary>
          (rectangle<perior::point<double,_2UL>_> *inner,
          rectangle<perior::point<double,_2UL>_> *outer,
          cubic_periodic_boundary<perior::point<double,_2UL>_> *b)

{
  double dVar1;
  double dVar2;
  const_reference pdVar3;
  reference pdVar4;
  array<double,_2UL> *this;
  double extraout_XMM0_Qa;
  ulong local_190;
  size_t i_2;
  undefined1 local_178 [8];
  point<double,_2UL> dc;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *b_local;
  rectangle<perior::point<double,_2UL>_> *outer_local;
  rectangle<perior::point<double,_2UL>_> *inner_local;
  ulong local_118;
  size_t i;
  point<double,_2UL> *retval;
  ulong local_c8;
  size_t i_1;
  
  dc.values_.elems[1] = (double)b;
  point<double,_2UL>::point((point<double,_2UL> *)&i_2);
  for (local_118 = 0; dVar1 = dc.values_.elems[1], local_118 < 2; local_118 = local_118 + 1) {
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)outer,local_118);
    dVar1 = *pdVar3;
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)inner,local_118);
    dVar2 = *pdVar3;
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_2,local_118);
    *pdVar4 = dVar1 - dVar2;
  }
  for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
    pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_2,local_c8);
    dVar2 = *pdVar4;
    pdVar3 = boost::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)((long)dVar1 + 0x30),local_c8);
    if (-*pdVar3 <= dVar2) {
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_2,local_c8);
      dVar2 = *pdVar4;
      pdVar3 = boost::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)((long)dVar1 + 0x30),local_c8);
      if (*pdVar3 <= dVar2) {
        pdVar3 = boost::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)((long)dVar1 + 0x20),local_c8);
        dVar2 = *pdVar3;
        pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_2,local_c8);
        *pdVar4 = *pdVar4 - dVar2;
      }
    }
    else {
      pdVar3 = boost::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)((long)dVar1 + 0x20),local_c8);
      dVar2 = *pdVar3;
      pdVar4 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)&i_2,local_c8);
      *pdVar4 = dVar2 + *pdVar4;
    }
  }
  point<double,_2UL>::point((point<double,_2UL> *)local_178,(point<double,_2UL> *)&i_2);
  local_190 = 0;
  while( true ) {
    if (1 < local_190) {
      return true;
    }
    this = (array<double,_2UL> *)local_178;
    boost::array<double,_2UL>::operator[](this,local_190);
    std::abs((int)this);
    pdVar3 = boost::array<double,_2UL>::operator[](&(outer->radius).values_,local_190);
    dVar1 = *pdVar3;
    pdVar3 = boost::array<double,_2UL>::operator[](&(inner->radius).values_,local_190);
    if (dVar1 - *pdVar3 < extraout_XMM0_Qa) break;
    local_190 = local_190 + 1;
  }
  return false;
}

Assistant:

inline typename boost::enable_if<traits::is_point<pointT>, bool>::type
within(const rectangle<pointT>& inner, const rectangle<pointT>& outer,
       const boundaryT<pointT>& b)
    BOOST_NOEXCEPT_OR_NOTHROW
{
    const pointT dc(restrict_direction(outer.center - inner.center, b));
    for(std::size_t i=0; i<traits::dimension<pointT>::value; ++i)
    {
        if(std::abs(dc[i]) > outer.radius[i] - inner.radius[i])
        {
            return false;
        }
    }
    return true;
}